

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldPtrsIteratorTest_ComparableConstConversion_Test::
TestBody(RepeatedPtrFieldPtrsIteratorTest_ComparableConstConversion_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_3a8;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_340;
  Message local_338;
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  local_330;
  bool local_321;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2f0;
  Message local_2e8;
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  local_2e0;
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2a0;
  Message local_298;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_258;
  Message local_250;
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  local_248;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_208;
  Message local_200;
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  local_1f8;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1b8;
  Message local_1b0;
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_168;
  Message local_160;
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_118;
  Message local_110;
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  local_108;
  iterator local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0;
  Message local_b8;
  iterator local_b0;
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_68 [3];
  Message local_50;
  bool local_41;
  undefined1 local_40 [8];
  AssertionResult gtest_ar_;
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*>
  local_28;
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  local_20;
  const_pointer_iterator iter2;
  pointer_iterator iter;
  RepeatedPtrFieldPtrsIteratorTest_ComparableConstConversion_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::pointer_begin(&(this->super_RepeatedPtrFieldPtrsIteratorTest).proto_array_);
  iter2.it_ = (void **)gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
  local_28.it_ = (void **)internal::operator+((iterator)
                                              gtest_ar_.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl,1);
  internal::
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  ::
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*,_nullptr>
            (&local_20,&local_28);
  local_41 = internal::operator==((iterator *)&iter2,(iterator *)&iter2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_40,&local_41,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_40,
               (AssertionResult *)"iter == iter","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x58f,pcVar2);
    testing::internal::AssertHelper::operator=(local_68,&local_50);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  internal::
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  ::
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*,_nullptr>
            (&local_a8,
             (RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*>
              *)&iter2);
  local_b0.it_ = (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::pointer_begin((this->super_RepeatedPtrFieldPtrsIteratorTest).
                                          const_proto_array_);
  local_99 = internal::operator==(&local_a8,&local_b0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_98,
               (AssertionResult *)"iter == const_proto_array_->pointer_begin()","false","true",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x590,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_100.it_ =
       (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pointer_begin((this->super_RepeatedPtrFieldPtrsIteratorTest).const_proto_array_);
  internal::
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  ::
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*,_nullptr>
            (&local_108,
             (RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*>
              *)&iter2);
  local_f1 = internal::operator==(&local_100,&local_108);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_f0,
               (AssertionResult *)"const_proto_array_->pointer_begin() == iter","false","true",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x591,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  internal::
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  ::
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*,_nullptr>
            (&local_158,
             (RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*>
              *)&iter2);
  local_149 = internal::operator!=(&local_158,&local_20);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_148,
               (AssertionResult *)"iter != iter2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x592,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  internal::
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  ::
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*,_nullptr>
            (&local_1a8,
             (RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*>
              *)&iter2);
  local_199 = internal::operator!=(&local_20,&local_1a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_198,
               (AssertionResult *)"iter2 != iter","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x593,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  internal::
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  ::
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*,_nullptr>
            (&local_1f8,
             (RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*>
              *)&iter2);
  local_1e9 = internal::operator<(&local_1f8,&local_20);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_1e8,
               (AssertionResult *)"iter < iter2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x594,pcVar2);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  internal::
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  ::
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*,_nullptr>
            (&local_248,
             (RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*>
              *)&iter2);
  local_239 = internal::operator<=(&local_248,&local_20);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_238,
               (AssertionResult *)"iter <= iter2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x595,pcVar2);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_289 = internal::operator<=((iterator *)&iter2,(iterator *)&iter2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_288,&local_289,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_288,
               (AssertionResult *)"iter <= iter","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x596,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  internal::
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  ::
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*,_nullptr>
            (&local_2e0,
             (RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*>
              *)&iter2);
  local_2d1 = internal::operator>(&local_20,&local_2e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_2d0,
               (AssertionResult *)"iter2 > iter","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x597,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  internal::
  RepeatedPtrOverPtrsIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*const,_const_void_*const>
  ::
  RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*,_nullptr>
            (&local_330,
             (RepeatedPtrOverPtrsIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*>
              *)&iter2);
  local_321 = internal::operator>=(&local_20,&local_330);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_320,&local_321,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_320,
               (AssertionResult *)"iter2 >= iter","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x598,pcVar2);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_371 = internal::operator>=((iterator *)&iter2,(iterator *)&iter2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a8,(internal *)local_370,(AssertionResult *)"iter >= iter","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x599,pcVar2);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldPtrsIteratorTest, ComparableConstConversion) {
  RepeatedPtrField<std::string>::pointer_iterator iter =
      proto_array_.pointer_begin();
  RepeatedPtrField<std::string>::const_pointer_iterator iter2 = iter + 1;
  EXPECT_TRUE(iter == iter);
  EXPECT_TRUE(iter == const_proto_array_->pointer_begin());
  EXPECT_TRUE(const_proto_array_->pointer_begin() == iter);
  EXPECT_TRUE(iter != iter2);
  EXPECT_TRUE(iter2 != iter);
  EXPECT_TRUE(iter < iter2);
  EXPECT_TRUE(iter <= iter2);
  EXPECT_TRUE(iter <= iter);
  EXPECT_TRUE(iter2 > iter);
  EXPECT_TRUE(iter2 >= iter);
  EXPECT_TRUE(iter >= iter);
}